

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

BrotliDecoderErrorCode
duckdb_brotli::CopyUncompressedBlockToOutput
          (size_t *available_out,uint8_t **next_out,size_t *total_out,BrotliDecoderStateInternal *s)

{
  uint8_t **ppuVar1;
  int iVar2;
  int iVar3;
  BrotliDecoderErrorCode BVar4;
  BrotliRunningUncompressedState BVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  size_t sVar8;
  int iVar9;
  uint64_t uVar10;
  uint8_t *__dest;
  bool bVar11;
  bool bVar12;
  
  iVar2 = BrotliEnsureRingBuffer(s);
  if (iVar2 == 0) {
    return BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1;
  }
  BVar5 = s->substate_uncompressed;
LAB_01d2c96e:
  if (BVar5 != BROTLI_STATE_UNCOMPRESSED_WRITE) goto code_r0x01d2c977;
  goto LAB_01d2ca77;
code_r0x01d2c977:
  if (BVar5 == BROTLI_STATE_UNCOMPRESSED_NONE) {
    uVar7 = (s->br).bit_pos_;
    uVar6 = (long)(s->br).last_in - (long)(s->br).next_in;
    iVar2 = (int)(uVar7 >> 3) + (int)uVar6;
    if (0x40000000 < uVar6) {
      iVar2 = 0x40000000;
    }
    if (s->meta_block_remaining_len < iVar2) {
      iVar2 = s->meta_block_remaining_len;
    }
    iVar3 = s->pos;
    iVar9 = s->ringbuffer_size - iVar3;
    if (iVar3 + iVar2 <= s->ringbuffer_size) {
      iVar9 = iVar2;
    }
    __dest = s->ringbuffer + iVar3;
    __n = (size_t)iVar9;
    bVar11 = iVar9 != 0;
    if ((7 < uVar7) && (iVar9 != 0)) {
      uVar10 = (s->br).val_;
      sVar8 = __n;
      do {
        *__dest = (uint8_t)uVar10;
        uVar7 = (s->br).bit_pos_ - 8;
        (s->br).bit_pos_ = uVar7;
        uVar10 = (s->br).val_ >> 8;
        (s->br).val_ = uVar10;
        __dest = __dest + 1;
        __n = sVar8 - 1;
        bVar11 = sVar8 != 1;
        if (uVar7 < 8) break;
        bVar12 = sVar8 != 1;
        sVar8 = __n;
      } while (bVar12);
    }
    if (uVar7 < 0x40) {
      (s->br).val_ = (s->br).val_ & ~(-1L << ((byte)uVar7 & 0x3f));
    }
    if (bVar11) {
      switchD_012bc561::default(__dest,(s->br).next_in,__n);
      ppuVar1 = &(s->br).next_in;
      *ppuVar1 = *ppuVar1 + __n;
    }
    iVar3 = s->pos + iVar9;
    s->pos = iVar3;
    iVar2 = s->meta_block_remaining_len;
    s->meta_block_remaining_len = iVar2 - iVar9;
    if (iVar3 < 1 << ((byte)(*(uint *)&s->field_0x304 >> 6) & 0x1f)) {
      return (uint)(iVar2 != iVar9) + BROTLI_DECODER_SUCCESS;
    }
    s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
LAB_01d2ca77:
    BVar4 = WriteRingBuffer(s,available_out,next_out,total_out,0);
    if (BVar4 != BROTLI_DECODER_SUCCESS) {
      return BVar4;
    }
    if (s->ringbuffer_size == 1 << ((byte)(*(uint *)&s->field_0x304 >> 6) & 0x1f)) {
      s->max_distance = s->max_backward_distance;
    }
    s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
    BVar5 = BROTLI_STATE_UNCOMPRESSED_NONE;
  }
  goto LAB_01d2c96e;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE CopyUncompressedBlockToOutput(size_t *available_out, uint8_t **next_out,
                                                                            size_t *total_out, BrotliDecoderState *s) {
	/* TODO(eustas): avoid allocation for single uncompressed block. */
	if (!BrotliEnsureRingBuffer(s)) {
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1);
	}

	/* State machine */
	for (;;) {
		switch (s->substate_uncompressed) {
		case BROTLI_STATE_UNCOMPRESSED_NONE: {
			int nbytes = (int)BrotliGetRemainingBytes(&s->br);
			if (nbytes > s->meta_block_remaining_len) {
				nbytes = s->meta_block_remaining_len;
			}
			if (s->pos + nbytes > s->ringbuffer_size) {
				nbytes = s->ringbuffer_size - s->pos;
			}
			/* Copy remaining bytes from s->br.buf_ to ring-buffer. */
			BrotliCopyBytes(&s->ringbuffer[s->pos], &s->br, (size_t)nbytes);
			s->pos += nbytes;
			s->meta_block_remaining_len -= nbytes;
			if (s->pos < 1 << s->window_bits) {
				if (s->meta_block_remaining_len == 0) {
					return BROTLI_DECODER_SUCCESS;
				}
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
		}
			/* Fall through. */

		case BROTLI_STATE_UNCOMPRESSED_WRITE: {
			BrotliDecoderErrorCode result;
			result = WriteRingBuffer(s, available_out, next_out, total_out, BROTLI_FALSE);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
			if (s->ringbuffer_size == 1 << s->window_bits) {
				s->max_distance = s->max_backward_distance;
			}
			s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
			break;
		}
		}
	}
	BROTLI_DCHECK(0); /* Unreachable */
}